

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty
          (FBXExportProperty *this,vector<float,_std::allocator<float>_> *va)

{
  size_type sVar1;
  uchar *puVar2;
  const_reference pvVar3;
  ulong local_40;
  size_t i;
  float *d;
  allocator<unsigned_char> local_19;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *va_local;
  FBXExportProperty *this_local;
  
  this->type = 'f';
  local_18 = va;
  va_local = (vector<float,_std::allocator<float>_> *)this;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(va);
  std::allocator<unsigned_char>::allocator(&local_19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,sVar1 << 2,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(local_18);
    if (sVar1 <= local_40) break;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_18,local_40);
    *(value_type *)(puVar2 + local_40 * 4) = *pvVar3;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const std::vector<float>& va)
: type('f')
, data(4 * va.size()) {
    float* d = reinterpret_cast<float*>(data.data());
    for (size_t i = 0; i < va.size(); ++i) {
        d[i] = va[i];
    }
}